

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeySymToKeyMapping.cpp
# Opt level: O3

Key sf::priv::keySymToKey(KeySym symbol)

{
  if ((long)symbol < 0xff13) {
    if ((long)symbol < 0xfe03) {
      switch(symbol) {
      case 0x20:
        return Space;
      case 0x27:
        return Apostrophe;
      case 0x2c:
        return Comma;
      case 0x2d:
        return Dash;
      case 0x2e:
switchD_00189e56_caseD_2e:
        return Period;
      case 0x2f:
        return Slash;
      case 0x30:
        return Num0;
      case 0x31:
        return Num1;
      case 0x32:
        return Num2;
      case 0x33:
        return Num3;
      case 0x34:
        return Num4;
      case 0x35:
        return Num5;
      case 0x36:
        return Num6;
      case 0x37:
        return Num7;
      case 0x38:
        return Num8;
      case 0x39:
        return Num9;
      case 0x3b:
        return SemiColon;
      case 0x3d:
        return Equal;
      case 0x5b:
        return LBracket;
      case 0x5c:
        return BackSlash;
      case 0x5d:
        return RBracket;
      case 0x60:
        return Grave;
      case 0x61:
        return A;
      case 0x62:
        return B;
      case 99:
        return C;
      case 100:
        return D;
      case 0x65:
        return E;
      case 0x66:
        return F;
      case 0x67:
        return G;
      case 0x68:
        return H;
      case 0x69:
        return I;
      case 0x6a:
        return J;
      case 0x6b:
        return K;
      case 0x6c:
        return L;
      case 0x6d:
        return M;
      case 0x6e:
        return N;
      case 0x6f:
        return O;
      case 0x70:
        return P;
      case 0x71:
        return Q;
      case 0x72:
        return R;
      case 0x73:
        return S;
      case 0x74:
        return T;
      case 0x75:
        return U;
      case 0x76:
        return V;
      case 0x77:
        return W;
      case 0x78:
        return X;
      case 0x79:
        return Y;
      case 0x7a:
        return Z;
      }
    }
    else if ((long)symbol < 0xff09) {
      if (symbol == 0xfe03) {
        return RAlt;
      }
      if (symbol == 0xff08) {
        return BackSpace;
      }
    }
    else {
      if (symbol == 0xff09) {
        return Tab;
      }
      if (symbol == 0xff0d) {
        return Enter;
      }
    }
  }
  else if ((long)symbol < 0xff8d) {
    switch(symbol) {
    case 0xff50:
      return Home;
    case 0xff51:
      return Left;
    case 0xff52:
      return Up;
    case 0xff53:
      return Right;
    case 0xff54:
      return Down;
    case 0xff55:
      return PageUp;
    case 0xff56:
      return PageDown;
    case 0xff57:
      return End;
    case 0xff58:
    case 0xff59:
    case 0xff5a:
    case 0xff5b:
    case 0xff5c:
    case 0xff5d:
    case 0xff5e:
    case 0xff5f:
    case 0xff60:
    case 0xff61:
    case 0xff62:
    case 0xff64:
    case 0xff65:
    case 0xff66:
      break;
    case 0xff63:
      return Insert;
    case 0xff67:
      return Menu;
    default:
      if (symbol == 0xff13) {
        return Pause;
      }
      if (symbol == 0xff1b) {
        return Escape;
      }
    }
  }
  else {
    switch(symbol) {
    case 0xff8d:
      return Enter;
    case 0xff8e:
    case 0xff8f:
    case 0xff90:
    case 0xff91:
    case 0xff92:
    case 0xff93:
    case 0xff94:
    case 0xffa0:
    case 0xffa1:
    case 0xffa2:
    case 0xffa3:
    case 0xffa4:
    case 0xffa5:
    case 0xffa6:
    case 0xffa7:
    case 0xffa8:
    case 0xffa9:
    case 0xffac:
    case 0xffae:
    case 0xffb0:
    case 0xffb1:
    case 0xffb2:
    case 0xffb3:
    case 0xffb4:
    case 0xffb5:
    case 0xffb6:
    case 0xffb7:
    case 0xffb8:
    case 0xffb9:
    case 0xffba:
    case 0xffbb:
    case 0xffbc:
    case 0xffbd:
    case 0xffcd:
    case 0xffce:
    case 0xffcf:
    case 0xffd0:
    case 0xffd1:
    case 0xffd2:
    case 0xffd3:
    case 0xffd4:
    case 0xffd5:
    case 0xffd6:
    case 0xffd7:
    case 0xffd8:
    case 0xffd9:
    case 0xffda:
    case 0xffdb:
    case 0xffdc:
    case 0xffdd:
    case 0xffde:
    case 0xffdf:
    case 0xffe0:
    case 0xffe5:
    case 0xffe6:
    case 0xffe7:
    case 0xffe8:
      break;
    case 0xff95:
      return Numpad7;
    case 0xff96:
      return Numpad4;
    case 0xff97:
      return Numpad8;
    case 0xff98:
      return Numpad6;
    case 0xff99:
      return Numpad2;
    case 0xff9a:
      return Numpad9;
    case 0xff9b:
      return Numpad3;
    case 0xff9c:
      return Numpad1;
    case 0xff9d:
      return Numpad5;
    case 0xff9e:
      return Numpad0;
    case 0xff9f:
      goto switchD_00189e56_caseD_2e;
    case 0xffaa:
      return Multiply;
    case 0xffab:
      return Add;
    case 0xffad:
      return Subtract;
    case 0xffaf:
      return Divide;
    case 0xffbe:
      return F1;
    case 0xffbf:
      return F2;
    case 0xffc0:
      return F3;
    case 0xffc1:
      return F4;
    case 0xffc2:
      return F5;
    case 0xffc3:
      return F6;
    case 0xffc4:
      return F7;
    case 0xffc5:
      return F8;
    case 0xffc6:
      return F9;
    case 0xffc7:
      return F10;
    case 0xffc8:
      return F11;
    case 0xffc9:
      return F12;
    case 0xffca:
      return F13;
    case 0xffcb:
      return F14;
    case 0xffcc:
      return F15;
    case 0xffe1:
      return LShift;
    case 0xffe2:
      return RShift;
    case 0xffe3:
      return LControl;
    case 0xffe4:
      return RControl;
    case 0xffe9:
      return LAlt;
    case 0xffea:
      return RAlt;
    case 0xffeb:
      return LSystem;
    case 0xffec:
      return RSystem;
    default:
      if (symbol == 0xffff) {
        return Delete;
      }
    }
  }
  return Unknown;
}

Assistant:

Keyboard::Key keySymToKey(KeySym symbol)
{
    switch (symbol)
    {
        case XK_Shift_L:      return Keyboard::LShift;
        case XK_Shift_R:      return Keyboard::RShift;
        case XK_Control_L:    return Keyboard::LControl;
        case XK_Control_R:    return Keyboard::RControl;
        case XK_Alt_L:        return Keyboard::LAlt;
        case XK_ISO_Level3_Shift:
        case XK_Alt_R:        return Keyboard::RAlt;
        case XK_Super_L:      return Keyboard::LSystem;
        case XK_Super_R:      return Keyboard::RSystem;
        case XK_Menu:         return Keyboard::Menu;
        case XK_Escape:       return Keyboard::Escape;
        case XK_semicolon:    return Keyboard::SemiColon;
        case XK_slash:        return Keyboard::Slash;
        case XK_equal:        return Keyboard::Equal;
        case XK_minus:        return Keyboard::Dash;
        case XK_bracketleft:  return Keyboard::LBracket;
        case XK_bracketright: return Keyboard::RBracket;
        case XK_comma:        return Keyboard::Comma;
        case XK_period:       return Keyboard::Period;
        case XK_apostrophe:   return Keyboard::Quote;
        case XK_backslash:    return Keyboard::BackSlash;
        case XK_grave:        return Keyboard::Grave;
        case XK_space:        return Keyboard::Space;
        case XK_Return:       return Keyboard::Return;
        case XK_KP_Enter:     return Keyboard::Return;
        case XK_BackSpace:    return Keyboard::BackSpace;
        case XK_Tab:          return Keyboard::Tab;
        case XK_Prior:        return Keyboard::PageUp;
        case XK_Next:         return Keyboard::PageDown;
        case XK_End:          return Keyboard::End;
        case XK_Home:         return Keyboard::Home;
        case XK_Insert:       return Keyboard::Insert;
        case XK_Delete:       return Keyboard::Delete;
        case XK_KP_Add:       return Keyboard::Add;
        case XK_KP_Subtract:  return Keyboard::Subtract;
        case XK_KP_Multiply:  return Keyboard::Multiply;
        case XK_KP_Divide:    return Keyboard::Divide;
        case XK_KP_Delete:    return Keyboard::Period;
        case XK_Pause:        return Keyboard::Pause;
        case XK_F1:           return Keyboard::F1;
        case XK_F2:           return Keyboard::F2;
        case XK_F3:           return Keyboard::F3;
        case XK_F4:           return Keyboard::F4;
        case XK_F5:           return Keyboard::F5;
        case XK_F6:           return Keyboard::F6;
        case XK_F7:           return Keyboard::F7;
        case XK_F8:           return Keyboard::F8;
        case XK_F9:           return Keyboard::F9;
        case XK_F10:          return Keyboard::F10;
        case XK_F11:          return Keyboard::F11;
        case XK_F12:          return Keyboard::F12;
        case XK_F13:          return Keyboard::F13;
        case XK_F14:          return Keyboard::F14;
        case XK_F15:          return Keyboard::F15;
        case XK_Left:         return Keyboard::Left;
        case XK_Right:        return Keyboard::Right;
        case XK_Up:           return Keyboard::Up;
        case XK_Down:         return Keyboard::Down;
        case XK_KP_Insert:    return Keyboard::Numpad0;
        case XK_KP_End:       return Keyboard::Numpad1;
        case XK_KP_Down:      return Keyboard::Numpad2;
        case XK_KP_Page_Down: return Keyboard::Numpad3;
        case XK_KP_Left:      return Keyboard::Numpad4;
        case XK_KP_Begin:     return Keyboard::Numpad5;
        case XK_KP_Right:     return Keyboard::Numpad6;
        case XK_KP_Home:      return Keyboard::Numpad7;
        case XK_KP_Up:        return Keyboard::Numpad8;
        case XK_KP_Page_Up:   return Keyboard::Numpad9;
        case XK_a:            return Keyboard::A;
        case XK_b:            return Keyboard::B;
        case XK_c:            return Keyboard::C;
        case XK_d:            return Keyboard::D;
        case XK_e:            return Keyboard::E;
        case XK_f:            return Keyboard::F;
        case XK_g:            return Keyboard::G;
        case XK_h:            return Keyboard::H;
        case XK_i:            return Keyboard::I;
        case XK_j:            return Keyboard::J;
        case XK_k:            return Keyboard::K;
        case XK_l:            return Keyboard::L;
        case XK_m:            return Keyboard::M;
        case XK_n:            return Keyboard::N;
        case XK_o:            return Keyboard::O;
        case XK_p:            return Keyboard::P;
        case XK_q:            return Keyboard::Q;
        case XK_r:            return Keyboard::R;
        case XK_s:            return Keyboard::S;
        case XK_t:            return Keyboard::T;
        case XK_u:            return Keyboard::U;
        case XK_v:            return Keyboard::V;
        case XK_w:            return Keyboard::W;
        case XK_x:            return Keyboard::X;
        case XK_y:            return Keyboard::Y;
        case XK_z:            return Keyboard::Z;
        case XK_0:            return Keyboard::Num0;
        case XK_1:            return Keyboard::Num1;
        case XK_2:            return Keyboard::Num2;
        case XK_3:            return Keyboard::Num3;
        case XK_4:            return Keyboard::Num4;
        case XK_5:            return Keyboard::Num5;
        case XK_6:            return Keyboard::Num6;
        case XK_7:            return Keyboard::Num7;
        case XK_8:            return Keyboard::Num8;
        case XK_9:            return Keyboard::Num9;
        default:              return Keyboard::Unknown;
    }
}